

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLifetimeTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::anon_unknown_1::TestGroup::init(TestGroup *this)

{
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  data;
  int extraout_EAX;
  RenderContext *renderCtx;
  TestContext *testCtx;
  ES2Types *this_00;
  Types *pTVar1;
  DefaultDeleter<deqp::gls::LifetimeTests::details::Types> local_55 [13];
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  *local_38;
  Context ltCtx;
  Context *ctx;
  TestGroup *this_local;
  
  ltCtx.m_testCtx = (TestContext *)TestCaseGroup::getContext(&this->super_TestCaseGroup);
  renderCtx = gles2::Context::getRenderContext((Context *)ltCtx.m_testCtx);
  testCtx = gles2::Context::getTestContext((Context *)ltCtx.m_testCtx);
  deqp::gls::LifetimeTests::details::Context::Context
            ((Context *)&stack0xffffffffffffffd8,renderCtx,testCtx);
  this_00 = (ES2Types *)operator_new(0x5e8);
  deqp::gls::LifetimeTests::details::ES2Types::ES2Types(this_00,(Context *)&stack0xffffffffffffffd8)
  ;
  de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>::DefaultDeleter(local_55);
  pTVar1 = (Types *)&stack0xffffffffffffffb8;
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::MovePtr();
  local_38 = de::details::MovePtr::operator_cast_to_PtrData
                       ((PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
                         *)pTVar1,(MovePtr *)this_00);
  data._8_8_ = local_38;
  data.ptr = pTVar1;
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::operator=(&this->m_types,data);
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::~MovePtr((MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
              *)&stack0xffffffffffffffb8);
  pTVar1 = de::details::
           UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
           ::operator*(&(this->m_types).
                        super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
                      );
  deqp::gls::LifetimeTests::details::addTestCases((TestCaseGroup *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	gles2::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types = MovePtr<Types>(new ES2Types(ltCtx));
	addTestCases(*this, *m_types);
}